

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::WeakDescriptorDataSection_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view prefix,Descriptor *descriptor,
          int index_in_file_messages,Options *options)

{
  long lVar1;
  size_t *psVar2;
  undefined4 in_register_0000008c;
  char *pcVar3;
  string_view name;
  string_view filename;
  Options *in_stack_fffffffffffffee8;
  undefined1 local_110 [48];
  char local_e0 [32];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pcVar3 = (char *)CONCAT44(in_register_0000008c,index_in_file_messages);
  local_90.piece_._M_str = (char *)prefix._M_len;
  lVar1 = *(long *)(prefix._M_str + 0x10);
  local_60.piece_._M_len = 3;
  local_60.piece_._M_str = "pb_";
  local_c0.piece_._M_len = 1;
  local_c0.piece_._M_str = "_";
  local_90.piece_._M_len = (size_t)this;
  local_110._32_8_ = absl::lts_20240722::numbers_internal::FastIntToBuffer((int)descriptor,local_e0)
  ;
  local_110._32_8_ = local_110._32_8_ - (long)local_e0;
  local_110._40_8_ = local_e0;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_60,&local_90,&local_c0);
  psVar2 = *(size_t **)(lVar1 + 8);
  name._M_str = (char *)psVar2[1];
  name._M_len = local_110._0_8_;
  filename._M_str = pcVar3;
  filename._M_len = *psVar2;
  UniqueName_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_110._8_8_,name,filename,in_stack_fffffffffffffee8);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WeakDescriptorDataSection(absl::string_view prefix,
                                      const Descriptor* descriptor,
                                      int index_in_file_messages,
                                      const Options& options) {
  const auto* file = descriptor->file();

  // To make a compact name we use the index of the object in its file
  // of its name.
  // So the name could be `pb_def_3_HASH` instead of
  // `pd_def_VeryLongClassName_WithNesting_AndMoreNames_HASH`
  // We need a know common prefix to merge the sections later on.
  return UniqueName(absl::StrCat("pb_", prefix, "_", index_in_file_messages),
                    file, options);
}